

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O1

bool __thiscall ConfigReader::parseArea(ConfigReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  _Alloc_hider _Var3;
  token_t tVar4;
  int *piVar5;
  undefined8 uVar6;
  bool bVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__endptr;
  _Alloc_hider __nptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  double dVar9;
  string w;
  string tokstr;
  string h;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  string local_78;
  double local_58;
  string local_50;
  
  paVar8 = &local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  __endptr = &local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)__endptr;
  local_78._M_dataplus._M_p = (pointer)paVar8;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  tVar4 = tokenize(this,&local_98);
  __nptr._M_p = (pointer)paVar8;
  if (tVar4 == TOK_NUMBER) {
    tVar4 = tokenize(this,&local_50);
    if (tVar4 == TOK_NUMBER) {
      tVar4 = tokenize(this,&local_78);
      __nptr._M_p = local_98._M_dataplus._M_p;
      if (tVar4 == TOK_SEMICOL) {
        piVar5 = __errno_location();
        iVar2 = *piVar5;
        *piVar5 = 0;
        __endptr = &local_b8;
        dVar9 = strtod(__nptr._M_p,(char **)&__endptr->_M_allocated_capacity);
        _Var3._M_p = local_50._M_dataplus._M_p;
        if ((pointer)local_b8._M_allocated_capacity == __nptr._M_p) {
          std::__throw_invalid_argument("stod");
          goto LAB_00129ceb;
        }
        local_58 = dVar9;
        if (*piVar5 == 0) {
          *piVar5 = iVar2;
        }
        else if (*piVar5 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_00129b75;
        }
        iVar2 = *piVar5;
        *piVar5 = 0;
        strtod(local_50._M_dataplus._M_p,(char **)&local_b8._M_allocated_capacity);
        if ((pointer)local_b8._M_allocated_capacity == _Var3._M_p) {
LAB_00129ceb:
          uVar6 = std::__throw_invalid_argument("stod");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p,
                            CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                     local_50.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,
                            CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                     local_78.field_2._M_local_buf[0]) + 1);
          }
          _Unwind_Resume(uVar6);
        }
        paVar8 = &local_78.field_2;
        __endptr = &local_98.field_2;
        if (*piVar5 == 0) {
LAB_00129cc5:
          *piVar5 = iVar2;
        }
        else if (*piVar5 == 0x22) {
          std::__throw_out_of_range("stod");
          goto LAB_00129cc5;
        }
        bVar7 = true;
        (*this->_vptr_ConfigReader[4])(local_58,this);
        goto LAB_00129c1c;
      }
      local_b8._M_allocated_capacity = (size_type)&local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Expected ;\n","");
      error(this,(string *)&local_b8);
    }
    else {
      local_b8._M_allocated_capacity = (size_type)&local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Expected a number for area height\n","");
      error(this,(string *)&local_b8);
    }
  }
  else {
LAB_00129b75:
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Expected a number for area width\n","");
    error(this,(string *)&local_b8);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__nptr._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_allocated_capacity != &local_a8) {
    operator_delete((void *)local_b8._M_allocated_capacity,local_a8._M_allocated_capacity + 1);
  }
  bVar7 = false;
LAB_00129c1c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != __endptr) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar8) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return bVar7;
}

Assistant:

bool ConfigReader::parseArea()
{
    // AREA: x y 
    std::string tokstr;
    std::string w,h;

    // width
    ConfigReader::token_t tok = tokenize(w);
    if (tok != TOK_NUMBER)
    {
        error("Expected a number for area width\n");
        return false;
    }

    // height
    tok = tokenize(h);
    if (tok != TOK_NUMBER)
    {
        error("Expected a number for area height\n");
        return false;
    }

    // expect semicol
    tok = tokenize(tokstr);
    if (tok != TOK_SEMICOL)
    {
        error("Expected ;\n");
        return false;
    }

    double wd, hd;
    try
    {
        wd = std::stod(w);
        hd = std::stod(h);
    }
    catch(const std::invalid_argument& ia)
    {
        error(ia.what());
        return false;
    }

    onArea(wd,hd);
    return true;
}